

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O0

feed_db_status_t store_calendar_dates_db(calendar_date_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  char local_88 [8];
  char qr [83];
  sqlite3_stmt *local_28;
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  calendar_date_t *record_local;
  
  stmt = (sqlite3_stmt *)db;
  db_local = (feed_db_t *)record;
  memcpy(local_88,
         "INSERT INTO calendar_dates (service_id, date, exception_type) values (?1, ?2, ?3);",0x53);
  sqlite3_prepare_v2(*(sqlite3 **)(stmt + 8),local_88,-1,&local_28,(char **)0x0);
  sqlite3_bind_text(local_28,1,(char *)db_local,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_28,2,(char *)&db_local[1].rc,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_28,3,*(int *)&db_local[1].field_0x24);
  iVar1 = sqlite3_step(local_28);
  *(int *)(stmt + 0x18) = iVar1;
  iVar1 = *(int *)(stmt + 0x18);
  if (iVar1 == 0x65) {
    sqlite3_finalize(local_28);
  }
  else {
    pcVar2 = sqlite3_errmsg(*(sqlite3 **)(stmt + 8));
    pcVar2 = strdup(pcVar2);
    *(char **)(stmt + 0x10) = pcVar2;
    sqlite3_finalize(local_28);
  }
  record_local._4_4_ = (feed_db_status_t)(iVar1 == 0x65);
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_calendar_dates_db(calendar_date_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO calendar_dates ("
                    "service_id, date, exception_type"
                ") values ("
                    "?1, ?2, ?3"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->service_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->date, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 3, (int)record->exception_type);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}